

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O0

void __thiscall
duckdb::QuantileBindData::QuantileBindData(QuantileBindData *this,QuantileBindData *other)

{
  bool bVar1;
  reference this_00;
  long in_RSI;
  FunctionData *in_RDI;
  FunctionData *this_01;
  QuantileValue *__args;
  QuantileValue *q;
  const_iterator __end1;
  const_iterator __begin1;
  vector<duckdb::QuantileValue,_true> *__range1;
  __normal_iterator<const_duckdb::QuantileValue_*,_std::vector<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>_>
  local_30;
  long local_28;
  long local_10;
  
  local_10 = in_RSI;
  FunctionData::FunctionData(in_RDI);
  *(undefined ***)in_RDI = &PTR__QuantileBindData_010a73a0;
  this_01 = in_RDI + 8;
  vector<duckdb::QuantileValue,_true>::vector((vector<duckdb::QuantileValue,_true> *)0x9b070d);
  __args = (QuantileValue *)(in_RDI + 0x20);
  vector<unsigned_long,_true>::vector
            ((vector<unsigned_long,_true> *)in_RDI,(vector<unsigned_long,_true> *)this_01);
  in_RDI[0x38] = (FunctionData)(*(byte *)(local_10 + 0x38) & 1);
  local_28 = local_10 + 8;
  local_30._M_current =
       (QuantileValue *)
       std::vector<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>::begin
                 ((vector<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_> *)this_01);
  std::vector<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>::end
            ((vector<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_> *)this_01);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_duckdb::QuantileValue_*,_std::vector<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>_>
                        *)in_RDI,
                       (__normal_iterator<const_duckdb::QuantileValue_*,_std::vector<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>_>
                        *)this_01);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_duckdb::QuantileValue_*,_std::vector<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>_>
              ::operator*(&local_30);
    std::vector<duckdb::QuantileValue,std::allocator<duckdb::QuantileValue>>::
    emplace_back<duckdb::QuantileValue_const&>
              ((vector<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_> *)this_00,
               __args);
    __gnu_cxx::
    __normal_iterator<const_duckdb::QuantileValue_*,_std::vector<duckdb::QuantileValue,_std::allocator<duckdb::QuantileValue>_>_>
    ::operator++(&local_30);
  }
  return;
}

Assistant:

QuantileBindData::QuantileBindData(const QuantileBindData &other) : order(other.order), desc(other.desc) {
	for (const auto &q : other.quantiles) {
		quantiles.emplace_back(q);
	}
}